

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O3

int __thiscall ev3dev::servo_motor::min_pulse_sp(servo_motor *this)

{
  int iVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"min_pulse_sp","");
  iVar1 = device::get_attr_int(&this->super_device,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return iVar1;
}

Assistant:

int min_pulse_sp() const { return get_attr_int("min_pulse_sp"); }